

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall soplex::CLUFactor<double>::solveLleftNoNZ(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  lVar8 = (long)this->thedim;
  if (lVar8 != 0) {
    pdVar4 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->l).ridx;
    piVar6 = (this->l).rbeg;
    piVar7 = (this->l).rorig;
    do {
      lVar10 = (long)piVar7[lVar8 + -1];
      dVar1 = vec[lVar10];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar2 = piVar6[lVar10];
        iVar3 = piVar6[lVar10 + 1];
        if (iVar2 < iVar3) {
          uVar9 = (iVar3 - iVar2) + 1;
          lVar10 = (long)iVar2 << 2;
          do {
            iVar2 = *(int *)((long)piVar5 + lVar10);
            vec[iVar2] = vec[iVar2] - *(double *)((long)pdVar4 + lVar10 * 2) * dVar1;
            uVar9 = uVar9 - 1;
            lVar10 = lVar10 + 4;
          } while (1 < uVar9);
        }
      }
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}